

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::PopulateTcParseEntries
          (Reflection *this,TailCallTableInfo *table_info,FieldEntry *entries)

{
  pointer pFVar1;
  FieldDescriptor *this_00;
  uint16_t uVar2;
  uint32_t uVar3;
  int iVar4;
  OneofDescriptor *pOVar5;
  FieldEntryInfo *entry;
  pointer pFVar6;
  
  pFVar1 = (table_info->field_entries).
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pFVar6 = (table_info->field_entries).
                super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                ._M_impl.super__Vector_impl_data._M_start; pFVar6 != pFVar1; pFVar6 = pFVar6 + 1) {
    this_00 = pFVar6->field;
    pOVar5 = FieldDescriptor::real_containing_oneof(this_00);
    uVar3 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,this_00);
    entries->offset = uVar3;
    if (pOVar5 == (OneofDescriptor *)0x0) {
      if ((this->schema_).has_bits_offset_ == -1) {
        iVar4 = 0;
      }
      else {
        uVar3 = internal::ReflectionSchema::HasBitsOffset(&this->schema_);
        iVar4 = uVar3 * 8 + pFVar6->hasbit_idx;
      }
    }
    else {
      iVar4 = (int)(((long)pOVar5 - (long)pOVar5->containing_type_->oneof_decls_) / 0x38) * 4 +
              (this->schema_).oneof_case_offset_;
    }
    entries->has_idx = iVar4;
    uVar2 = pFVar6->type_card;
    entries->aux_idx = pFVar6->aux_idx;
    entries->type_card = uVar2;
    entries = entries + 1;
  }
  return;
}

Assistant:

void Reflection::PopulateTcParseEntries(
    internal::TailCallTableInfo& table_info,
    TcParseTableBase::FieldEntry* entries) const {
  for (const auto& entry : table_info.field_entries) {
    const FieldDescriptor* field = entry.field;
    const OneofDescriptor* oneof = field->real_containing_oneof();
    entries->offset = schema_.GetFieldOffset(field);
    if (oneof != nullptr) {
      entries->has_idx = schema_.oneof_case_offset_ + 4 * oneof->index();
    } else if (schema_.HasHasbits()) {
      entries->has_idx =
          static_cast<int>(8 * schema_.HasBitsOffset() + entry.hasbit_idx);
    } else {
      entries->has_idx = 0;
    }
    entries->aux_idx = entry.aux_idx;
    entries->type_card = entry.type_card;
    ++entries;
  }
}